

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

void push_back(c2m_ctx_t c2m_ctx,VARR_token_t *tokens)

{
  size_t sVar1;
  token_t t;
  ulong ix;
  
  sVar1 = VARR_token_tlength(tokens);
  ix = sVar1 & 0xffffffff;
  while (0 < (int)ix) {
    ix = ix - 1;
    t = VARR_token_tget(tokens,ix);
    unget_next_pptoken(c2m_ctx,t);
  }
  return;
}

Assistant:

static void push_back (c2m_ctx_t c2m_ctx, VARR (token_t) * tokens) {
#ifdef C2MIR_PREPRO_DEBUG
  pre_ctx_t pre_ctx = c2m_ctx->pre_ctx;
  fprintf (stderr,
           "# push back (macro call depth %d):", VARR_LENGTH (macro_call_t, macro_call_stack));
#endif
  for (int i = (int) VARR_LENGTH (token_t, tokens) - 1; i >= 0; i--) {
#ifdef C2MIR_PREPRO_DEBUG
    fprintf (stderr, " <%s>", get_token_str (VARR_GET (token_t, tokens, i)));
#endif
    unget_next_pptoken (c2m_ctx, VARR_GET (token_t, tokens, i));
  }
#ifdef C2MIR_PREPRO_DEBUG
  fprintf (stderr, "\n");
  print_output_buffer (c2m_ctx);
#endif
}